

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O2

Point * __thiscall astar::Point::operator+=(Point *this,Point *p)

{
  uint uVar1;
  uint uVar2;
  LogStream *pLVar3;
  int iVar4;
  LogStream local_30;
  
  uVar1 = p->x;
  if (((((int)uVar1 < 1) || (this->x <= (int)(uVar1 ^ 0x7fffffff))) &&
      ((uVar2 = p->y, (int)uVar2 < 1 || (this->y <= (int)(uVar2 ^ 0x7fffffff))))) &&
     ((-1 < (int)uVar1 || ((int)(-0x80000000 - uVar1) <= this->x)))) {
    if ((int)uVar2 < 0) {
      iVar4 = this->y;
      if (iVar4 < (int)(-0x80000000 - uVar2)) goto LAB_001025d9;
    }
    else {
      iVar4 = this->y;
    }
    this->x = this->x + uVar1;
    this->y = iVar4 + uVar2;
  }
  else {
LAB_001025d9:
    local_30.data._M_dataplus._M_p = (pointer)&local_30.data.field_2;
    local_30.data.field_2._M_allocated_capacity = 0;
    local_30.data.field_2._8_8_ = 0;
    local_30.data._M_string_length = 0;
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((char *)&local_30);
    pLVar3 = details::LogStream::operator<<(&local_30,0x1e);
    std::__cxx11::string::append((char *)pLVar3);
    std::__cxx11::string::append((char *)pLVar3);
    details::LogStream::~LogStream(&local_30);
  }
  return this;
}

Assistant:

Point& Point::operator+=(const Point& p)
{
    if ((p.x > 0 && INT32_MAX - p.x < x) || (p.y > 0 && INT32_MAX - p.y < y) || (p.x < 0 && INT32_MIN - p.x > x) ||
        (p.y < 0 && INT32_MIN - p.y > y)) {
        ALOG() << "add point is out of range.";
        return *this;
    }
    x += p.x;
    y += p.y;
    return *this;
}